

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

void rtrim(char *str)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = strlen(str);
  if (0 < (long)sVar1) {
    lVar2 = sVar1 + 1;
    do {
      if (str[lVar2 + -2] != ' ') {
        return;
      }
      str[lVar2 + -2] = '\0';
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  return;
}

Assistant:

static void rtrim(char *str)
{
    long length;

    length = (long)strlen(str);
    while (length > 0 && str[length - 1] == ' ')
    {
        str[length - 1] = '\0';
        length--;
    }
}